

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  pointer pOVar1;
  uint **ppuVar2;
  IRContext *this_00;
  bool bVar3;
  char cVar4;
  uint **ppuVar5;
  Instruction *inst;
  Instruction *pIVar6;
  pointer pOVar7;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  **local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  ReplaceDescArrayAccessUsingVarIndex *local_48;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *local_40;
  uint *local_38;
  
  inst = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
         super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar6 = &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (inst != pIVar6) {
    local_48 = this;
    local_40 = old_ids_to_new_ids;
    do {
      uStack_60 = 0;
      local_68 = local_40;
      pcStack_50 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:244:32)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:244:32)>
                 ::_M_manager;
      uStack_80 = 0;
      local_88 = &local_68;
      pcStack_70 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                 ::_M_manager;
      pOVar1 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar7 = (inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar1; pOVar7 = pOVar7 + 1
          ) {
        bVar3 = spvIsInIdType(pOVar7->type);
        if (bVar3) {
          ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar5 = &(pOVar7->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar5 = ppuVar2;
          }
          local_38 = *ppuVar5;
          if (local_78 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar4 = (*pcStack_70)(&local_88,&local_38);
          if (cVar4 == '\0') break;
        }
      }
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,3);
      }
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      this_00 = (local_48->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      analysis::DefUseManager::AnalyzeInstUse
                ((this_00->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
      inst = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (inst != pIVar6);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock(
    BasicBlock* block,
    const std::unordered_map<uint32_t, uint32_t>& old_ids_to_new_ids) const {
  for (auto block_itr = block->begin(); block_itr != block->end();
       ++block_itr) {
    (&*block_itr)->ForEachInId([&old_ids_to_new_ids](uint32_t* idp) {
      auto old_ids_to_new_ids_itr = old_ids_to_new_ids.find(*idp);
      if (old_ids_to_new_ids_itr == old_ids_to_new_ids.end()) return;
      *idp = old_ids_to_new_ids_itr->second;
    });
    get_def_use_mgr()->AnalyzeInstUse(&*block_itr);
  }
}